

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendedKalmanFilter.cpp
# Opt level: O0

bool __thiscall
iDynTree::DiscreteExtendedKalmanFilterHelper::ekfInit(DiscreteExtendedKalmanFilterHelper *this)

{
  long in_RDI;
  bool local_1;
  
  if (((*(long *)(in_RDI + 8) == 0) || (*(long *)(in_RDI + 0x10) == 0)) ||
     (*(long *)(in_RDI + 0x18) == 0)) {
    iDynTree::reportError
              ("DiscreteExtendedKalmanFilterHelper","init",
               "state or input or output size not set, exiting.");
    local_1 = false;
  }
  else {
    iDynTree::VectorDynSize::resize(in_RDI + 0x20);
    iDynTree::VectorDynSize::zero();
    iDynTree::VectorDynSize::resize(in_RDI + 0x80);
    iDynTree::VectorDynSize::zero();
    iDynTree::VectorDynSize::resize(in_RDI + 0x40);
    iDynTree::VectorDynSize::zero();
    iDynTree::VectorDynSize::resize(in_RDI + 0x60);
    iDynTree::VectorDynSize::zero();
    iDynTree::MatrixDynSize::resize(in_RDI + 0xa0,*(ulong *)(in_RDI + 8));
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize(in_RDI + 200,*(ulong *)(in_RDI + 8));
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize(in_RDI + 0xf0,*(ulong *)(in_RDI + 8));
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize(in_RDI + 0x118,*(ulong *)(in_RDI + 8));
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize(in_RDI + 0x140,*(ulong *)(in_RDI + 0x10));
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize(in_RDI + 0x168,*(ulong *)(in_RDI + 0x10));
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize(in_RDI + 400,*(ulong *)(in_RDI + 8));
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize(in_RDI + 0x1b8,*(ulong *)(in_RDI + 0x10));
    iDynTree::MatrixDynSize::zero();
    *(undefined1 *)(in_RDI + 0x1e0) = 1;
    local_1 = (bool)(*(byte *)(in_RDI + 0x1e0) & 1);
  }
  return local_1;
}

Assistant:

bool iDynTree::DiscreteExtendedKalmanFilterHelper::ekfInit()
{
    if (m_dim_X == 0 || m_dim_Y == 0 || m_dim_U == 0)
    {
        iDynTree::reportError("DiscreteExtendedKalmanFilterHelper", "init", "state or input or output size not set, exiting.");
        return false;
    }

    // resize state related quantities
    m_x.resize(m_dim_X); m_x.zero();
    m_xhat.resize(m_dim_X); m_xhat.zero();
    m_u.resize(m_dim_U); m_u.zero();
    m_y.resize(m_dim_Y); m_y.zero();

    m_F.resize(m_dim_X, m_dim_X);
    m_F.zero();
    m_P.resize(m_dim_X, m_dim_X);
    m_P.zero();
    m_Phat.resize(m_dim_X, m_dim_X);
    m_Phat.zero();
    m_Q.resize(m_dim_X, m_dim_X);
    m_Q.zero();

    m_H.resize(m_dim_Y, m_dim_X);
    m_H.zero();
    m_S.resize(m_dim_Y, m_dim_Y);
    m_S.zero();
    m_K.resize(m_dim_X, m_dim_Y);
    m_K.zero();
    m_R.resize(m_dim_Y, m_dim_Y);
    m_R.zero();

    m_is_initialized = true;
    return m_is_initialized;
}